

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

reference __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::front(span<int,_18446744073709551615UL> *this)

{
  logic_error *this_00;
  contract_violation local_20;
  
  if (this->size_ != 0) {
    return this->data_;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  detail::contract_violation::contract_violation
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1281: Precondition violation."
            );
  std::logic_error::logic_error(this_00,&local_20.super_logic_error);
  *(undefined ***)this_00 = &PTR__logic_error_001b6c70;
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_nodiscard span_constexpr bool empty() const span_noexcept
    {
        return size() == 0;
    }